

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall
cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
          (ValueBuilder *this,IString target,Ref args,Ref args_1)

{
  Value *pVVar1;
  Ref RVar2;
  char *extraout_RDX;
  IString name;
  Ref local_70;
  Value *local_68;
  Value *local_60;
  size_t i;
  Ref argArray [2];
  Ref local_40;
  Ref callArgs;
  size_t nArgs;
  Ref args_local_1;
  Ref args_local;
  IString target_local;
  
  target_local.str._M_len = target.str._M_len;
  callArgs.inst = (Value *)0x2;
  local_40 = makeRawArray(2);
  i = (size_t)target.str._M_str;
  argArray[0].inst = args.inst;
  for (local_60 = (Value *)0x0; local_60 < callArgs.inst;
      local_60 = (Value *)((long)&local_60->type + 1)) {
    pVVar1 = Ref::operator->(&local_40);
    local_68 = argArray[(long)&local_60[-1].field_1.num + 0xf].inst;
    cashew::Value::push_back(pVVar1,(Ref)local_68);
  }
  local_70 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_70);
  RVar2 = makeRawString((IString *)CALL);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  name.str._M_str = extraout_RDX;
  name.str._M_len = target_local.str._M_len;
  RVar2 = makeName(this,name);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  pVVar1 = cashew::Value::push_back(pVVar1,local_40);
  Ref::Ref((Ref *)&target_local.str._M_str,pVVar1);
  return (Ref)(Value *)target_local.str._M_str;
}

Assistant:

static Ref makeCall(IString target, Ts... args) {
    size_t nArgs = sizeof...(Ts);
    Ref callArgs = makeRawArray(nArgs);
    Ref argArray[] = {args...};
    for (size_t i = 0; i < nArgs; ++i) {
      callArgs->push_back(argArray[i]);
    }
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(makeName(target))
              .push_back(callArgs);
  }